

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image2D.cpp
# Opt level: O2

void __thiscall Image2D::Image2D(Image2D *this,string *name,string *type,int width,int height)

{
  bool bVar1;
  FileType FVar2;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  this->m_width = width;
  this->m_height = height;
  this->m_components = 3;
  std::ofstream::ofstream(&this->m_ofstream);
  bVar1 = std::operator==(type,"PPM");
  FVar2 = PPM;
  if (!bVar1) {
    bVar1 = std::operator==(type,"PNG");
    if (bVar1) {
      FVar2 = PNG;
    }
    else {
      bVar1 = std::operator==(type,"BMP");
      if (bVar1) {
        FVar2 = BMP;
      }
      else {
        bVar1 = std::operator==(type,"TGA");
        if (bVar1) {
          FVar2 = TGA;
        }
        else {
          bVar1 = std::operator==(type,"HDR");
          if (!bVar1) {
            return;
          }
          FVar2 = HDR;
        }
      }
    }
  }
  this->m_type = FVar2;
  return;
}

Assistant:

Image2D::Image2D(const std::string &name, const std::string &type, int width, int height)
: m_name(name),
  m_width(width),
  m_height(height),
  m_components(3)
{
	if (type == "PPM") {
		m_type = FileType::PPM;
	}
	else if (type == "PNG") {
		m_type = FileType::PNG;
	}
	else if (type == "BMP") {
		m_type = FileType::BMP;
	}
	else if (type == "TGA") {
		m_type = FileType::TGA;
	}
	else if (type == "HDR") {
		m_type = FileType::HDR;
	}
}